

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedTimeSamples<double>::add_blocked_sample(TypedTimeSamples<double> *this,double t)

{
  undefined1 local_30 [8];
  Sample s;
  double t_local;
  TypedTimeSamples<double> *this_local;
  
  s._16_8_ = t;
  Sample::Sample((Sample *)local_30);
  local_30 = (undefined1  [8])s._16_8_;
  s.value._0_1_ = 1;
  ::std::
  vector<tinyusdz::TypedTimeSamples<double>::Sample,std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<double>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<double>::Sample,std::allocator<tinyusdz::TypedTimeSamples<double>::Sample>>
              *)this,(Sample *)local_30);
  this->_dirty = true;
  return;
}

Assistant:

void add_blocked_sample(const double t) {
    Sample s;
    s.t = t;
    s.blocked = true;
    _samples.emplace_back(s);
    _dirty = true;
  }